

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

string * __thiscall
flatbuffers::php::PhpGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,PhpGenerator *this,Type *type)

{
  char *__s;
  undefined4 local_28;
  undefined4 local_24;
  Parser *local_20;
  string *psStack_18;
  ushort local_10;
  
  switch(*(undefined4 *)&(this->super_BaseGenerator)._vptr_BaseGenerator) {
  case 0xd:
    __s = "__string";
    break;
  case 0xe:
    local_28 = *(undefined4 *)((long)&(this->super_BaseGenerator)._vptr_BaseGenerator + 4);
    local_10 = *(ushort *)&(this->super_BaseGenerator).file_name_;
    local_24 = 0;
    local_20 = (this->super_BaseGenerator).parser_;
    psStack_18 = (this->super_BaseGenerator).path_;
    GenGetter_abi_cxx11_
              (__return_storage_ptr__,(PhpGenerator *)&stack0xffffffffffffffd8,
               (Type *)(ulong)local_10);
    return __return_storage_ptr__;
  case 0xf:
    __s = "__struct";
    break;
  case 0x10:
    __s = "__union";
    break;
  default:
    __s = "Get";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&stack0xffffffffffffffd8);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenGetter(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "__string";
      case BASE_TYPE_STRUCT: return "__struct";
      case BASE_TYPE_UNION: return "__union";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      default: return "Get";
    }
  }